

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::SimpleTypeHandler<6UL>::SetIsPrototype(SimpleTypeHandler<6UL> *this,DynamicObject *instance)

{
  bool bVar1;
  SimpleDictionaryTypeHandler *pSVar2;
  DynamicObject *instance_local;
  SimpleTypeHandler<6UL> *this_local;
  
  bVar1 = DynamicTypeHandler::ChangeTypeOnProto();
  if ((bVar1) ||
     ((bVar1 = DynamicTypeHandler::GetIsOrMayBecomeShared(&this->super_DynamicTypeHandler), bVar1 &&
      (bVar1 = DynamicTypeHandler::IsolatePrototypes(), bVar1)))) {
    pSVar2 = ConvertToSimpleDictionaryType(this,instance);
    (*(pSVar2->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x52])(pSVar2,instance);
  }
  return;
}

Assistant:

void SimpleTypeHandler<size>::SetIsPrototype(DynamicObject* instance)
    {
        // Don't return if IsPrototypeFlag is set, because we may still need to do a type transition and
        // set fixed bits.  If this handler is shared, this instance may not even be a prototype yet.
        // In this case we may need to convert to a non-shared type handler.
        if (!ChangeTypeOnProto() && !(GetIsOrMayBecomeShared() && IsolatePrototypes()))
        {
            return;
        }

        ConvertToSimpleDictionaryType(instance)->SetIsPrototype(instance);
    }